

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void NotifyCallback(AmsAddr *pAddr,AdsNotificationHeader *pNotification,uint32_t hUser)

{
  long lVar1;
  long lVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 in_register_00000014;
  
  if (NotifyCallback(AmsAddr_const*,AdsNotificationHeader_const*,unsigned_int)::notificationOutput
      == '\0') {
    iVar3 = __cxa_guard_acquire(&NotifyCallback(AmsAddr_const*,AdsNotificationHeader_const*,unsigned_int)
                                 ::notificationOutput,pNotification,
                                CONCAT44(in_register_00000014,hUser));
    if (iVar3 != 0) {
      std::ostream::ostream
                (NotifyCallback(AmsAddr_const*,AdsNotificationHeader_const*,unsigned_int)::
                 notificationOutput,(streambuf *)0x0);
      __cxa_atexit(std::ostream::~ostream,
                   NotifyCallback(AmsAddr_const*,AdsNotificationHeader_const*,unsigned_int)::
                   notificationOutput,&__dso_handle);
      __cxa_guard_release(&NotifyCallback(AmsAddr_const*,AdsNotificationHeader_const*,unsigned_int)
                           ::notificationOutput);
    }
  }
  g_NumNotifications = g_NumNotifications + 1;
  poVar4 = std::operator<<(NotifyCallback(AmsAddr_const*,AdsNotificationHeader_const*,unsigned_int)
                           ::notificationOutput,0x30);
  poVar4 = std::operator<<(poVar4,"NetId 0x");
  poVar4 = (ostream *)operator<<(poVar4,&pAddr->netId);
  poVar4 = std::operator<<(poVar4,"hUser 0x");
  lVar1 = *(long *)poVar4;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 8;
  *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," sample time: ");
  *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
       *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," sample size: ");
  *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
       *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," value: 0x");
  *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
       *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(uint)(byte)pNotification[1].nTimeStamp);
  std::operator<<(poVar4,'\n');
  return;
}

Assistant:

static void NotifyCallback(const AmsAddr* pAddr, const AdsNotificationHeader* pNotification, uint32_t hUser)
{
#if 0
    static std::ostream& notificationOutput = std::cout;
#else
    static std::ostream notificationOutput(0);
#endif
    ++g_NumNotifications;
    auto pData = reinterpret_cast<const uint8_t*>(pNotification + 1);
    notificationOutput << std::setfill('0') <<
        "NetId 0x" << pAddr->netId <<
        "hUser 0x" << std::hex << std::setw(4) << hUser <<
        " sample time: " << std::dec << pNotification->nTimeStamp <<
        " sample size: " << std::dec << pNotification->cbSampleSize <<
        " value: 0x" << std::hex << (int)pData[0] << '\n';
}